

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::RunContext::handleUnfinishedSections(RunContext *this)

{
  bool bVar1;
  reference pSVar2;
  undefined1 local_20 [8];
  reverse_iterator itEnd;
  reverse_iterator it;
  RunContext *this_local;
  
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::rbegin
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)&itEnd);
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::rend
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)local_20);
  while( true ) {
    bVar1 = std::operator!=(&itEnd,(reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
                                    *)local_20);
    if (!bVar1) break;
    pSVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
             ::operator*(&itEnd);
    (*(this->super_IResultCapture)._vptr_IResultCapture[3])(this,pSVar2);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
    ::operator++(&itEnd);
  }
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::clear
            (&this->m_unfinishedSections);
  return;
}

Assistant:

void RunContext::handleUnfinishedSections() {
        // If sections ended prematurely due to an exception we stored their
        // infos here so we can tear them down outside the unwind process.
        for (auto it = m_unfinishedSections.rbegin(),
            itEnd = m_unfinishedSections.rend();
            it != itEnd;
            ++it)
            sectionEnded(*it);
        m_unfinishedSections.clear();
    }